

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::parseLine(Parser *this)

{
  Type TVar1;
  Type TVar2;
  bool bVar3;
  iterator iVar4;
  undefined8 extraout_RAX;
  string *this_00;
  Parser *pPVar5;
  AstNode instructionNode;
  Token colonToken;
  Token keywordToken;
  Token nextToken;
  Token labelToken;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  undefined1 local_150 [48];
  undefined1 local_120 [48];
  Token local_f0;
  undefined1 local_c0 [64];
  string local_80 [32];
  undefined1 local_60 [48];
  
  peekToken(&labelToken,this);
  if (labelToken.type == IdentifierToken) {
    readToken((Token *)&instructionNode,this);
    Token::operator=(&labelToken,(Token *)&instructionNode);
    std::__cxx11::string::~string((string *)&instructionNode.bValue);
    readToken(&colonToken,this);
    if (colonToken.type == DelimiterToken) {
      bVar3 = std::operator!=(&colonToken.tokenData,":");
      if (!bVar3) {
        instructionNode.type = LabelNode;
        instructionNode.sValue._M_dataplus._M_p = (pointer)&instructionNode.sValue.field_2;
        instructionNode.aValue = 0;
        instructionNode.bValue = 0;
        instructionNode.sValue._M_string_length = 0;
        instructionNode.sValue.field_2._M_local_buf[0] = '\0';
        instructionNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        instructionNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        instructionNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)&instructionNode.sValue);
        std::vector<AstNode,_std::allocator<AstNode>_>::emplace_back<AstNode>
                  (&(this->_ast).rootNode.children,&instructionNode);
        AstNode::~AstNode(&instructionNode);
        std::__cxx11::string::~string((string *)&colonToken.tokenData);
        goto LAB_0010ad75;
      }
    }
    std::__cxx11::string::string
              ((string *)&local_170,"colon expected",(allocator *)&instructionNode);
    pPVar5 = (Parser *)local_c0;
    Token::Token((Token *)pPVar5,&colonToken);
    parserError(pPVar5,&local_170,(Token *)local_c0);
LAB_0010afd3:
    std::__cxx11::string::string
              ((string *)&local_190,"keyword expected",(allocator *)&instructionNode);
    pPVar5 = (Parser *)&local_f0;
    Token::Token((Token *)pPVar5,&keywordToken);
    parserError(pPVar5,&local_190,&local_f0);
  }
  else {
LAB_0010ad75:
    peekToken((Token *)&instructionNode,this);
    TVar1 = instructionNode.type;
    std::__cxx11::string::~string((string *)&instructionNode.bValue);
    if (TVar1 == NumberNode) {
      readToken((Token *)local_60,this);
      this_00 = (string *)(local_60 + 0x10);
LAB_0010af6f:
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::~string((string *)&labelToken.tokenData);
      return;
    }
    readToken(&keywordToken,this);
    if (keywordToken.type != KeywordToken) goto LAB_0010afd3;
    instructionNode.sValue._M_dataplus._M_p = (pointer)&instructionNode.sValue.field_2;
    instructionNode.type = NullNode;
    instructionNode.aValue = 0;
    instructionNode.bValue = 0;
    instructionNode.sValue._M_string_length = 0;
    instructionNode.sValue.field_2._M_local_buf[0] = '\0';
    instructionNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    instructionNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    instructionNode.children.super__Vector_base<AstNode,_std::allocator<AstNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)this,&keywordToken.tokenData);
    if (iVar4.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(this->_instructions)._M_h,&keywordToken.tokenData);
      if (iVar4.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) goto LAB_0010b059;
      instructionNode.type = InstructionNode;
    }
    else {
      instructionNode.type = DirectiveNode;
    }
    std::__cxx11::string::_M_assign((string *)&instructionNode.sValue);
    peekToken(&nextToken,this);
    while (nextToken.type == DelimiterToken) {
      bVar3 = std::operator==(&nextToken.tokenData,",");
      if (!bVar3) break;
      readToken((Token *)(local_c0 + 0x30),this);
      std::__cxx11::string::~string(local_80);
      peekToken(&colonToken,this);
      TVar2 = colonToken.type;
      std::__cxx11::string::~string((string *)&colonToken.tokenData);
      if (TVar2 != LineTerminatorToken) {
        parseExpression((AstNode *)&colonToken,this);
        std::vector<AstNode,_std::allocator<AstNode>_>::push_back
                  (&instructionNode.children,(AstNode *)&colonToken);
        AstNode::~AstNode((AstNode *)&colonToken);
      }
      peekToken(&colonToken,this);
      Token::operator=(&nextToken,&colonToken);
      std::__cxx11::string::~string((string *)&colonToken.tokenData);
    }
    std::vector<AstNode,_std::allocator<AstNode>_>::push_back
              (&(this->_ast).rootNode.children,&instructionNode);
    readToken(&colonToken,this);
    Token::operator=(&nextToken,&colonToken);
    std::__cxx11::string::~string((string *)&colonToken.tokenData);
    if (nextToken.type == LineTerminatorToken) {
      std::__cxx11::string::~string((string *)&nextToken.tokenData);
      AstNode::~AstNode(&instructionNode);
      this_00 = (string *)&keywordToken.tokenData;
      goto LAB_0010af6f;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_1d0,"line terminator expected",(allocator *)&colonToken);
  pPVar5 = (Parser *)local_150;
  Token::Token((Token *)pPVar5,&nextToken);
  parserError(pPVar5,&local_1d0,(Token *)local_150);
LAB_0010b059:
  std::__cxx11::string::string((string *)&local_1b0,"unrecognized keyword",(allocator *)&colonToken)
  ;
  pPVar5 = (Parser *)local_120;
  Token::Token((Token *)pPVar5,&keywordToken);
  parserError(pPVar5,&local_1b0,(Token *)local_120);
  std::__cxx11::string::~string((string *)(local_120 + 0x10));
  std::__cxx11::string::~string((string *)&local_1b0);
  AstNode::~AstNode(&instructionNode);
  std::__cxx11::string::~string((string *)&keywordToken.tokenData);
  std::__cxx11::string::~string((string *)&labelToken.tokenData);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::parseLine() {
    Token labelToken = peekToken();

    // Parse label (optional)

    if(labelToken.type == Token::IdentifierToken) {
        labelToken = readToken();
        Token colonToken = readToken();

        if(colonToken.type != Token::DelimiterToken || colonToken.tokenData != ":") {
            parserError("colon expected", colonToken);
        }

        auto labelNode = AstNode{AstNode::LabelNode};
        labelNode.sValue = labelToken.tokenData;
        _ast.rootNode.children.push_back(std::move(labelNode));
    }

    // Parse keyword

    if(peekToken().type == Token::LineTerminatorToken) {
        readToken(); // Line with just label
        return;
    }

    Token keywordToken = readToken();

    if(keywordToken.type != Token::KeywordToken) {
        parserError("keyword expected", keywordToken);
    }

    AstNode instructionNode;
    if(_directives.find(keywordToken.tokenData) != _directives.end()) {
        instructionNode.type = AstNode::DirectiveNode;
    } else if(_instructions.find(keywordToken.tokenData) != _instructions.end()) {
        instructionNode.type = AstNode::InstructionNode;
    } else {
        parserError("unrecognized keyword", keywordToken);
    }

    instructionNode.sValue = keywordToken.tokenData;

    // Parse args

    Token nextToken = peekToken();

    while(nextToken.type == Token::DelimiterToken && nextToken.tokenData == ",") {
        readToken();
        if(peekToken().type != Token::LineTerminatorToken) {
            AstNode expressionNode = parseExpression();
            instructionNode.children.push_back(expressionNode);
        }
        nextToken = peekToken();
    }

    _ast.rootNode.children.push_back(instructionNode);

    nextToken = readToken();
    if(nextToken.type != Token::LineTerminatorToken) {
        parserError("line terminator expected", nextToken);
    }

}